

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cartesian_cubic.hpp
# Opt level: O1

int * __thiscall sisl::cartesian_cubic<int>::operator()(cartesian_cubic<int> *this,int d0,...)

{
  int *piVar1;
  uint in_EDX;
  va_list vl;
  uint local_a0;
  
  piVar1 = &this->__zero;
  this->__zero = 0;
  if ((((-1 < d0) && ((uint)d0 <= this->_nx)) && (-1 < (int)in_EDX)) &&
     (((in_EDX <= this->_ny && (-1 < (int)local_a0)) && (local_a0 <= this->_nz)))) {
    piVar1 = array_n<int,_3,_std::allocator<int>_>::operator()(&this->_array,d0);
  }
  return piVar1;
}

Assistant:

virtual T& operator()(int d0, ...) {
            int _x = d0, _y = 0, _z = 0; va_list vl;
            va_start(vl, d0);
            _y = va_arg(vl, int);
            _z = va_arg(vl, int);
            va_end(vl);
            __zero = 0;


            if(!in_bound(_x,_y, _z)) return __zero;
            return _array(_x, _y, _z);
        }